

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O0

bool testAccEval<double,GridMethodBatch>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  double err;
  string local_a0;
  vector *local_70;
  vector<double,_std::allocator<double>_> *test_x;
  vector<double,_std::allocator<double>_> temp_x;
  vector<double,_std::allocator<double>_> test_y;
  string *message_local;
  TasmanianSparseGrid *grid_local;
  double tolerance_local;
  int numx_local;
  vector<double,_std::allocator<double>_> *y_local;
  vector<double,_std::allocator<double>_> *x_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &temp_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&test_x);
  iVar2 = TasGrid::TasmanianSparseGrid::getNumDimensions(grid);
  sVar3 = TasGrid::Utils::size_mult<int,int>(iVar2,numx);
  local_70 = (vector *)getVector(x,(vector<double,_std::allocator<double>_> *)&test_x,sVar3);
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)grid,local_70);
  iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  sVar3 = TasGrid::Utils::size_mult<int,int>(numx,iVar2);
  err = err1<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                  (sVar3,(vector<double,_std::allocator<double>_> *)
                         &temp_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,y);
  std::__cxx11::string::string((string *)&local_a0,(string *)message);
  bVar1 = testPass(err,tolerance,&local_a0,grid);
  std::__cxx11::string::~string((string *)&local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&test_x);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &temp_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return bVar1;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}